

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_set_tuning(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  aom_tune_metric *paVar3;
  av1_extracfg extra_cfg;
  av1_extracfg aStack_268;
  
  memcpy(&aStack_268,&ctx->extra_cfg,600);
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    paVar3 = (aom_tune_metric *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    paVar3 = (aom_tune_metric *)args->overflow_arg_area;
    args->overflow_arg_area = paVar3 + 2;
  }
  aStack_268.tuning = *paVar3;
  if ((aStack_268.tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) {
    if ((ctx->cfg).g_usage != 2) {
      return AOM_CODEC_INCAPABLE;
    }
    aStack_268.enable_qm = 1;
    aStack_268.qm_min = 2;
    aStack_268.qm_max = 10;
    aStack_268.sharpness = 7;
    aStack_268.dist_metric = AOM_DIST_METRIC_QM_PSNR;
    aStack_268.enable_cdef = 3;
    aStack_268.enable_chroma_deltaq = 1;
    aStack_268.deltaq_mode = '\x06';
  }
  aVar2 = update_extra_cfg(ctx,&aStack_268);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_tuning(aom_codec_alg_priv_t *ctx,
                                       va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.tuning = CAST(AOME_SET_TUNING, args);
  aom_codec_err_t err = handle_tuning(ctx, &extra_cfg);
  if (err != AOM_CODEC_OK) return err;
  return update_extra_cfg(ctx, &extra_cfg);
}